

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O3

void tcp_pinger_new(int vectored_writes)

{
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  sockaddr_in server_addr;
  undefined1 auStack_28 [16];
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_28);
  if (iVar1 == 0) {
    piVar2 = (int *)malloc(0x2978);
    if (piVar2 == (int *)0x0) goto LAB_0016462e;
    *piVar2 = vectored_writes;
    piVar2[1] = 0;
    piVar2[2] = 0;
    uVar3 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar3,piVar2 + 4);
    *(int **)(piVar2 + 4) = piVar2;
    if (iVar1 != 0) goto LAB_00164633;
    iVar1 = uv_tcp_connect(piVar2 + 0x46,piVar2 + 4,auStack_28,pinger_on_connect);
    if (iVar1 == 0) {
      if (pinger_on_connect_count == 0) {
        return;
      }
      goto LAB_0016463d;
    }
  }
  else {
    tcp_pinger_new_cold_1();
LAB_0016462e:
    tcp_pinger_new_cold_5();
LAB_00164633:
    tcp_pinger_new_cold_2();
  }
  tcp_pinger_new_cold_3();
LAB_0016463d:
  tcp_pinger_new_cold_4();
  uVar3 = uv_default_loop();
  uv_run(uVar3,0);
  if (completed_pingers == 1) {
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    uv_run(uVar3,0);
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    run_ping_pong_test_cold_1();
  }
  run_ping_pong_test_cold_2();
  tcp_pinger_new(1);
  run_ping_pong_test();
  return;
}

Assistant:

static void tcp_pinger_new(int vectored_writes) {
  int r;
  struct sockaddr_in server_addr;
  pinger_t *pinger;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &server_addr));
  pinger = malloc(sizeof(*pinger));
  ASSERT(pinger != NULL);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;

  /* Try to connect to the server and do NUM_PINGS ping-pongs. */
  r = uv_tcp_init(uv_default_loop(), &pinger->stream.tcp);
  pinger->stream.tcp.data = pinger;
  ASSERT(!r);

  /* We are never doing multiple reads/connects at a time anyway, so these
   * handles can be pre-initialized. */
  r = uv_tcp_connect(&pinger->connect_req,
                     &pinger->stream.tcp,
                     (const struct sockaddr*) &server_addr,
                     pinger_on_connect);
  ASSERT(!r);

  /* Synchronous connect callbacks are not allowed. */
  ASSERT(pinger_on_connect_count == 0);
}